

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# special_functions.hpp
# Opt level: O2

longdouble *
trng::math::detail::GammaPQ_asympt_R<long_double>
          (longdouble *__return_storage_ptr__,longdouble a,longdouble eta,longdouble eta_squard_half
          )

{
  long lVar1;
  longdouble *plVar2;
  long lVar3;
  longdouble in_ST0;
  longdouble lVar4;
  longdouble lVar5;
  undefined1 local_21c [12];
  long local_210;
  longdouble local_204;
  longdouble beta [31];
  
  beta[0x1e] = _DAT_00261780;
  beta[0x1d] = _DAT_00261790;
  lVar3 = 0x1e0;
  for (lVar1 = 0x1c; -1 < lVar1; lVar1 = lVar1 + -1) {
    local_210 = lVar1 + 2;
    *(longdouble *)(local_21c + lVar3 + 4) =
         *(longdouble *)("N5Catch10BinaryExprIRKeS2_EE" + lVar3 + 0x1b) +
         ((longdouble)local_210 * *(longdouble *)((long)beta + lVar3)) / a;
    lVar3 = lVar3 + -0x10;
  }
  lVar5 = (longdouble)1;
  lVar4 = (longdouble)0;
  for (lVar1 = 0; local_21c._0_10_ = lVar4, lVar1 != 0x1f0; lVar1 = lVar1 + 0x10) {
    local_21c._0_10_ = *(longdouble *)((long)beta + lVar1) * lVar5 + lVar4;
    if (((longdouble)local_21c._0_10_ == lVar4) &&
       (!NAN((longdouble)local_21c._0_10_) && !NAN(lVar4))) break;
    lVar5 = lVar5 * eta;
    lVar4 = (longdouble)local_21c._0_10_;
  }
  local_21c._0_10_ = (longdouble)local_21c._0_10_ / ((longdouble)1 + beta[1] / a);
  local_204 = a;
  expl();
  local_21c._0_10_ = (longdouble)local_21c._0_10_ * in_ST0;
  plVar2 = (longdouble *)sqrtl();
  return plVar2;
}

Assistant:

TRNG_CUDA_ENABLE T GammaPQ_asympt_R(T a, T eta, T eta_squard_half) {
        GammaPQ_asympt_coefficients<T> coeffs;
        constexpr std::size_t n{coeffs.max_index() - 1};
        T beta[n];
        beta[n - 1] = coeffs.get(n);
        beta[n - 2] = coeffs.get(n - 1);
        for (std::ptrdiff_t i{n - 3}; i >= 0; --i)
          beta[i] = beta[i + 2] * (i + 2) / a + coeffs.get(i + 1);
        T eta_to_the_i{1};
        T y{0};
        for (std::size_t i{0}; i < n; ++i) {
          const T y_old{y};
          y += beta[i] * eta_to_the_i;
          if (y == y_old)
            break;
          eta_to_the_i *= eta;
        }
        return y / (1 + beta[1] / a) * exp(-a * eta_squard_half) / sqrt(a) *
               constants<T>::one_over_sqrt_2pi;
      }